

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O2

void __thiscall wallet::OutputGroup::OutputGroup(OutputGroup *this,CoinSelectionParams *params)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_outputs).
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outputs).
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outputs).
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_from_me = true;
  this->m_value = 0;
  this->m_depth = 999;
  this->m_ancestors = 0;
  this->m_descendants = 0;
  this->long_term_fee = 0;
  this->effective_value = 0;
  this->fee = 0;
  (this->m_long_term_feerate).nSatoshisPerK = (params->m_long_term_feerate).nSatoshisPerK;
  this->m_subtract_fee_outputs = params->m_subtract_fee_outputs;
  this->m_weight = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

OutputGroup(const CoinSelectionParams& params) :
        m_long_term_feerate(params.m_long_term_feerate),
        m_subtract_fee_outputs(params.m_subtract_fee_outputs)
    {}